

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

bool __thiscall
wallet::anon_unknown_5::WalletImpl::tryGetTxStatus
          (WalletImpl *this,uint256 *txid,WalletTxStatus *tx_status,int *num_blocks,
          int64_t *block_time)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> func;
  Chain *pCVar5;
  time_t tVar6;
  element_type *wtx;
  int *in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RDI;
  time_t *in_R8;
  long in_FS_OFFSET;
  iterator mi;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> locked_wallet;
  FoundBlock *in_stack_fffffffffffffea8;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 uVar7;
  char *in_stack_fffffffffffffed0;
  FoundBlock *this_00;
  char *in_stack_fffffffffffffed8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int line;
  char *file;
  undefined7 in_stack_ffffffffffffff08;
  bool local_b5;
  undefined8 local_b4;
  undefined8 local_ac;
  undefined8 local_a4;
  FoundBlock local_88;
  char local_38 [16];
  undefined1 local_28 [32];
  long local_8;
  
  line = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffea8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffea8);
  file = local_38;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0
             ,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             SUB41((uint)in_stack_fffffffffffffec8 >> 0x18,0));
  uVar1 = UniqueLock::operator_cast_to_bool
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffea8)
  ;
  if ((bool)uVar1) {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffea8);
    func._M_cur = (__node_type *)
                  std::
                  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                  ::find(in_stack_fffffffffffffeb0,(key_type *)in_stack_fffffffffffffea8);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffea8);
    std::
    unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
    ::end(in_stack_fffffffffffffeb0);
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                       (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_stack_fffffffffffffeb0);
    if (bVar2) {
      local_b5 = false;
    }
    else {
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_fffffffffffffea8);
      iVar4 = CWallet::GetLastBlockHeight
                        ((CWallet *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      *in_RCX = iVar4;
      *in_R8 = -1;
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_fffffffffffffea8);
      pCVar5 = CWallet::chain((CWallet *)
                              CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_fffffffffffffea8);
      CWallet::GetLastBlockHash
                ((CWallet *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      local_88.m_data = (CBlock *)0x0;
      local_88.found = false;
      local_88._73_7_ = 0;
      local_88.m_locator = (CBlockLocator *)0x0;
      local_88.m_next_block = (FoundBlock *)0x0;
      local_88.m_mtp_time = (int64_t *)0x0;
      local_88.m_in_active_chain = (bool *)0x0;
      local_88.m_time = (int64_t *)0x0;
      local_88.m_max_time = (int64_t *)0x0;
      local_88.m_hash = (uint256 *)0x0;
      local_88.m_height = (int *)0x0;
      this_00 = &local_88;
      interfaces::FoundBlock::FoundBlock(in_stack_fffffffffffffea8);
      tVar6 = interfaces::FoundBlock::time(this_00,in_R8);
      uVar3 = (**(code **)(*(long *)pCVar5 + 0x50))(pCVar5,local_28,tVar6);
      uVar7 = CONCAT13(uVar3,(int3)in_stack_fffffffffffffecc);
      inline_check_non_fatal<bool>
                ((bool *)CONCAT17(uVar1,in_stack_ffffffffffffff08),file,line,(char *)func._M_cur,
                 (char *)CONCAT44(iVar4,in_stack_fffffffffffffee8));
      wtx = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
      operator->((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                 in_stack_fffffffffffffea8);
      MakeWalletTxStatus((CWallet *)CONCAT44(uVar7,in_stack_fffffffffffffec8),(CWalletTx *)wtx);
      *in_RDX = local_b4;
      in_RDX[1] = local_ac;
      in_RDX[2] = local_a4;
      local_b5 = true;
    }
  }
  else {
    local_b5 = false;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_b5;
  }
  __stack_chk_fail();
}

Assistant:

bool tryGetTxStatus(const uint256& txid,
        interfaces::WalletTxStatus& tx_status,
        int& num_blocks,
        int64_t& block_time) override
    {
        TRY_LOCK(m_wallet->cs_wallet, locked_wallet);
        if (!locked_wallet) {
            return false;
        }
        auto mi = m_wallet->mapWallet.find(txid);
        if (mi == m_wallet->mapWallet.end()) {
            return false;
        }
        num_blocks = m_wallet->GetLastBlockHeight();
        block_time = -1;
        CHECK_NONFATAL(m_wallet->chain().findBlock(m_wallet->GetLastBlockHash(), FoundBlock().time(block_time)));
        tx_status = MakeWalletTxStatus(*m_wallet, mi->second);
        return true;
    }